

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# core.h
# Opt level: O0

basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
fmt::v5::
format<fmt::v5::basic_string_view<char>,int,int,int,int,int,int,int,int,int,int,int,int,int,int,int,int,int,int,int,int,int>
          (basic_string_view<char> *format_str,int *args,int *args_1,int *args_2,int *args_3,
          int *args_4,int *args_5,int *args_6,int *args_7,int *args_8,int *args_9,int *args_10,
          int *args_11,int *args_12,int *args_13,int *args_14,int *args_15,int *args_16,int *args_17
          ,int *args_18,int *args_19,int *args_20)

{
  size_t in_RDX;
  undefined8 *in_RSI;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RDI;
  basic_string_view<char> s;
  int *in_stack_00000040;
  int *in_stack_00000088;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args_21;
  basic_string_view<char> *in_stack_fffffffffffffca8;
  checked_args<fmt::v5::basic_string_view<char>,_int,_int,_int,_int,_int,_int,_int,_int,_int,_int,_int,_int,_int,_int,_int,_int,_int,_int,_int,_int,_int>
  *in_stack_fffffffffffffcb0;
  int *in_stack_fffffffffffffcf0;
  int *in_stack_fffffffffffffcf8;
  int *in_stack_fffffffffffffd00;
  int *in_stack_fffffffffffffd08;
  int *in_stack_fffffffffffffd10;
  int *in_stack_fffffffffffffd18;
  int *in_stack_fffffffffffffd20;
  int *in_stack_fffffffffffffd28;
  int *in_stack_fffffffffffffd30;
  int *in_stack_fffffffffffffd38;
  int *in_stack_fffffffffffffd40;
  int *in_stack_fffffffffffffd48;
  int *in_stack_fffffffffffffd50;
  int *in_stack_fffffffffffffd58;
  int *in_stack_fffffffffffffd60;
  int *in_stack_fffffffffffffd68;
  int *in_stack_fffffffffffffd70;
  basic_format_args<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
  in_stack_fffffffffffffe40;
  basic_string_view<char> in_stack_fffffffffffffe50;
  
  s.size_ = in_RDX;
  s.data_ = (char *)in_RSI[1];
  args_21 = in_RDI;
  to_string_view<char>((v5 *)*in_RSI,s);
  internal::
  checked_args<fmt::v5::basic_string_view<char>,_int,_int,_int,_int,_int,_int,_int,_int,_int,_int,_int,_int,_int,_int,_int,_int,_int,_int,_int,_int,_int>
  ::checked_args(in_stack_fffffffffffffcb0,in_stack_fffffffffffffca8,(int *)args_21,(int *)in_RDI,
                 in_stack_00000088,in_stack_00000040,in_stack_fffffffffffffcf0,
                 in_stack_fffffffffffffcf8,in_stack_fffffffffffffd00,in_stack_fffffffffffffd08,
                 in_stack_fffffffffffffd10,in_stack_fffffffffffffd18,in_stack_fffffffffffffd20,
                 in_stack_fffffffffffffd28,in_stack_fffffffffffffd30,in_stack_fffffffffffffd38,
                 in_stack_fffffffffffffd40,in_stack_fffffffffffffd48,in_stack_fffffffffffffd50,
                 in_stack_fffffffffffffd58,in_stack_fffffffffffffd60,in_stack_fffffffffffffd68,
                 in_stack_fffffffffffffd70);
  internal::
  checked_args<fmt::v5::basic_string_view<char>,_int,_int,_int,_int,_int,_int,_int,_int,_int,_int,_int,_int,_int,_int,_int,_int,_int,_int,_int,_int,_int>
  ::operator*((checked_args<fmt::v5::basic_string_view<char>,_int,_int,_int,_int,_int,_int,_int,_int,_int,_int,_int,_int,_int,_int,_int,_int,_int,_int,_int,_int,_int>
               *)0x2199f1);
  internal::vformat<char>(in_stack_fffffffffffffe50,in_stack_fffffffffffffe40);
  return args_21;
}

Assistant:

inline std::basic_string<FMT_CHAR(S)> format(
    const S &format_str, const Args &... args) {
  return internal::vformat(
    to_string_view(format_str),
    *internal::checked_args<S, Args...>(format_str, args...));
}